

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall
CGameClient::CClientData::UpdateBotRenderInfo
          (CClientData *this,CGameClient *pGameClient,int ClientID)

{
  int iVar1;
  int in_EDX;
  ulong uVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uchar *pBotColor;
  vector4_base<float> local_28;
  vector4_base<float> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RSI + 0xe28 + (long)in_EDX * 8) == 0) ||
     ((**(uint **)(in_RSI + 0xe28 + (long)in_EDX * 8) & 0x40) == 0)) {
    IGraphics::CTextureHandle::Invalidate((CTextureHandle *)(in_RDI + 0x4d0));
    vector4_base<float>::vector4_base(&local_28,0.0,0.0,0.0,0.0);
    *(undefined8 *)(in_RDI + 0x4d8) = local_28._0_8_;
    *(undefined8 *)(in_RDI + 0x4e0) = local_28._8_8_;
  }
  else {
    *(undefined4 *)(in_RDI + 0x4d0) = *(undefined4 *)(*(long *)(in_RSI + 0x1b1c8) + 0x14);
    if ((*(float *)(in_RDI + 0x4e4) == 0.0) && (!NAN(*(float *)(in_RDI + 0x4e4)))) {
      iVar1 = rand();
      uVar2 = (ulong)(long)iVar1 % 0xc;
      vector4_base<float>::vector4_base
                (&local_18,(float)UpdateBotRenderInfo::s_aBotColors[uVar2][0] / 255.0,
                 (float)UpdateBotRenderInfo::s_aBotColors[uVar2][1] / 255.0,
                 (float)UpdateBotRenderInfo::s_aBotColors[uVar2][2] / 255.0,1.0);
      *(undefined8 *)(in_RDI + 0x4d8) = local_18._0_8_;
      *(undefined8 *)(in_RDI + 0x4e0) = local_18._8_8_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::CClientData::UpdateBotRenderInfo(CGameClient *pGameClient, int ClientID)
{
	static const unsigned char s_aBotColors[][3] = {
		{0xff,0x00,0x00},
		{0xff,0x66,0x00},
		{0x4d,0x9f,0x45},
		{0xd5,0x9e,0x29},
		{0x9f,0xd3,0xa9},
		{0xbd,0xd8,0x5e},
		{0xc0,0x7f,0x94},
		{0xc3,0xa2,0x67},
		{0xf8,0xa8,0x3b},
		{0xcc,0xe2,0xbf},
		{0xe6,0xb4,0x98},
		{0x74,0xc7,0xa3},
	};

	if(pGameClient->m_Snap.m_paPlayerInfos[ClientID] && pGameClient->m_Snap.m_paPlayerInfos[ClientID]->m_PlayerFlags&PLAYERFLAG_BOT)
	{
		m_RenderInfo.m_BotTexture = pGameClient->m_pSkins->m_BotTexture;
		if(!m_RenderInfo.m_BotColor.a) // bot color has not been set; pick a random color once
		{
			const unsigned char* pBotColor = s_aBotColors[rand()%(sizeof(s_aBotColors)/sizeof(s_aBotColors[0]))];
			m_RenderInfo.m_BotColor = vec4(pBotColor[0]/255.f, pBotColor[1]/255.f, pBotColor[2]/255.f, 1.0f);
		}
	}
	else
	{
		m_RenderInfo.m_BotTexture.Invalidate();
		m_RenderInfo.m_BotColor = vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}